

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O0

GPU_RendererID * GPU_GetRendererID(GPU_RendererID *__return_storage_ptr__,GPU_RendererEnum renderer)

{
  int iVar1;
  undefined4 uVar2;
  long lVar3;
  int local_10;
  int i;
  GPU_RendererEnum renderer_local;
  
  gpu_init_renderer_register();
  local_10 = 0;
  while( true ) {
    if (9 < local_10) {
      GPU_MakeRendererID(__return_storage_ptr__,"Unknown",0,0,0);
      return __return_storage_ptr__;
    }
    if (_gpu_renderer_register[local_10].id.renderer == renderer) break;
    local_10 = local_10 + 1;
  }
  lVar3 = (long)local_10;
  __return_storage_ptr__->name = _gpu_renderer_register[lVar3].id.name;
  iVar1 = _gpu_renderer_register[lVar3].id.major_version;
  __return_storage_ptr__->renderer = _gpu_renderer_register[lVar3].id.renderer;
  __return_storage_ptr__->major_version = iVar1;
  uVar2 = *(undefined4 *)&_gpu_renderer_register[lVar3].id.field_0x14;
  __return_storage_ptr__->minor_version = _gpu_renderer_register[lVar3].id.minor_version;
  *(undefined4 *)&__return_storage_ptr__->field_0x14 = uVar2;
  return __return_storage_ptr__;
}

Assistant:

GPU_RendererID GPU_GetRendererID(GPU_RendererEnum renderer)
{
	int i;

	gpu_init_renderer_register();

	for(i = 0; i < GPU_MAX_REGISTERED_RENDERERS; i++)
	{
		if(_gpu_renderer_register[i].id.renderer == renderer)
			return _gpu_renderer_register[i].id;
	}
	
	return GPU_MakeRendererID("Unknown", GPU_RENDERER_UNKNOWN, 0, 0);
}